

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

void __thiscall kratos::Const::set_is_packed(Const *this,bool value)

{
  UserException *this_00;
  undefined7 in_register_00000031;
  string local_40;
  
  if ((int)CONCAT71(in_register_00000031,value) != 0) {
    return;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Unable to set const unpacked","");
  UserException::UserException(this_00,&local_40);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Const::set_is_packed(bool value) {
    if (!value) throw UserException("Unable to set const unpacked");
}